

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O2

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitStructSet(InternalAnalyzer *this,StructSet *curr)

{
  EffectAnalyzer *pEVar1;
  bool bVar2;
  
  bVar2 = Type::isNull((Type *)(*(long *)(curr + 0x18) + 8));
  pEVar1 = this->parent;
  if (bVar2) {
    pEVar1->trap = true;
  }
  else {
    pEVar1->writesStruct = true;
    if (((uint)*(ulong *)(*(long *)(curr + 0x18) + 8) & 3) == 2 &&
        6 < *(ulong *)(*(long *)(curr + 0x18) + 8)) {
      pEVar1->implicitTrap = true;
    }
    if (*(int *)(curr + 0x28) != 0) {
      pEVar1->isAtomic = true;
    }
  }
  return;
}

Assistant:

void visitStructSet(StructSet* curr) {
      if (curr->ref->type.isNull()) {
        parent.trap = true;
        return;
      }
      parent.writesStruct = true;
      // traps when the arg is null
      if (curr->ref->type.isNullable()) {
        parent.implicitTrap = true;
      }
      if (curr->order != MemoryOrder::Unordered) {
        parent.isAtomic = true;
      }
    }